

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O3

void __thiscall HandleManager::HandleManager(HandleManager *this)

{
  _Rb_tree_header *p_Var1;
  MutexFactory *this_00;
  Mutex *pMVar2;
  
  this->_vptr_HandleManager = (_func_int **)&PTR__HandleManager_0019d990;
  p_Var1 = &(this->handles)._M_t._M_impl.super__Rb_tree_header;
  (this->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->handles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = MutexFactory::i();
  pMVar2 = MutexFactory::getMutex(this_00);
  this->handlesMutex = pMVar2;
  this->handleCounter = 0;
  return;
}

Assistant:

HandleManager::HandleManager()
{
	handlesMutex = MutexFactory::i()->getMutex();
	handleCounter = 0;
}